

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection_yolo.cpp
# Opt level: O2

void drawPred(int classId,float conf,int left,int top,int right,int bottom,Mat *frame)

{
  undefined8 uVar1;
  int baseLine;
  Size labelSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string label;
  int local_a0;
  int local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  Matx<double,_4,_1> local_58;
  
  local_e8.field_2._M_allocated_capacity = 0;
  local_e8._M_dataplus._M_p._0_4_ = 0x3010000;
  local_e8._M_string_length = (size_type)frame;
  local_68 = right;
  local_64 = bottom;
  local_60 = left;
  local_5c = top;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&label);
  label._M_dataplus._M_p = (pointer)0x406fe00000000000;
  label._M_string_length = 0x4066400000000000;
  label.field_2._M_allocated_capacity = 0x4049000000000000;
  label.field_2._8_8_ = 0;
  cv::rectangle(&local_e8,&local_60,&local_68,&label,3,8,0);
  cv::format_abi_cxx11_((char *)&label,SUB84((double)conf,0),"%.2f");
  if (classes_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      classes_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((int)((ulong)((long)classes_abi_cxx11_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)classes_abi_cxx11_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) <= classId) {
      std::__cxx11::string::string
                ((string *)&local_e8,"classId < (int)classes.size()",(allocator *)&local_98);
      uVar1 = cv::error(-0xd7,(string *)&local_e8,"drawPred",
                        "/workspace/llm4binary/github/license_c_cmakelists/madhu-korada[P]YOLO-IOU-cpp/object_detection_yolo.cpp"
                        ,0x1bc);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&label);
      _Unwind_Resume(uVar1);
    }
    std::operator+(&local_98,
                   classes_abi_cxx11_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + classId,":");
    std::operator+(&local_e8,&local_98,&label);
    std::__cxx11::string::operator=((string *)&label,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  cv::getTextSize((string *)&labelSize,(int)&label,0.5,0,(int *)0x1);
  if (top < labelSize.height) {
    top = labelSize.height;
  }
  local_98.field_2._M_allocated_capacity = 0;
  local_98._M_dataplus._M_p._0_4_ = 0x3010000;
  local_9c = top - labelSize.height;
  local_70 = labelSize.width + left;
  local_6c = baseLine + top;
  local_a0 = left;
  local_98._M_string_length = (size_type)frame;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_e8);
  local_e8._M_dataplus._M_p = (pointer)0x406fe00000000000;
  local_e8._M_string_length = 0x406fe00000000000;
  local_e8.field_2._M_allocated_capacity = 0x406fe00000000000;
  local_e8.field_2._8_8_ = 0;
  cv::rectangle(&local_98,&local_a0,&local_70,&local_e8,0xffffffffffffffff,8,0);
  local_e8.field_2._M_allocated_capacity = 0;
  local_e8._M_dataplus._M_p._0_4_ = 0x3010000;
  local_e8._M_string_length = (size_type)frame;
  local_78 = left;
  local_74 = top;
  cv::Matx<double,_4,_1>::Matx(&local_58);
  local_58.val[2] = 0.0;
  local_58.val[3] = 0.0;
  local_58.val[0] = 0.0;
  local_58.val[1] = 0.0;
  cv::putText(0,&local_e8,&label,&local_78,0,&local_58,1,8,0);
  std::__cxx11::string::~string((string *)&label);
  return;
}

Assistant:

void drawPred(int classId, float conf, int left, int top, int right, int bottom, cv::Mat& frame)
{
    //Draw a rectangle displaying the bounding box
    cv::rectangle(frame, cv::Point(left, top), cv::Point(right, bottom), cv::Scalar(255, 178, 50), 3);
    
    //Get the label for the class name and its confidence
    std::string label = cv::format("%.2f", conf);
    if (!classes.empty())
    {
        CV_Assert(classId < (int)classes.size());
        label = classes[classId] + ":" + label;
    }
    
    //Display the label at the top of the bounding box
    int baseLine;
    cv::Size labelSize = cv::getTextSize(label, cv::FONT_HERSHEY_SIMPLEX, 0.5, 1, &baseLine);
    top = cv::max(top, labelSize.height);
    cv::rectangle(frame, cv::Point(left, top - round(1*labelSize.height)), cv::Point(left + round(1*labelSize.width), top + baseLine), cv::Scalar(255, 255, 255), cv::FILLED);
    cv::putText(frame, label, cv::Point(left, top), cv::FONT_HERSHEY_SIMPLEX, 0.5, cv::Scalar(0,0,0),1);
}